

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_assign.hpp
# Opt level: O3

void remora::bindings::
     matrix_assign_functor<remora::device_traits<remora::cpu_tag>::multiply_and_add<double>,remora::dense_matrix_adaptor<double,remora::row_major,remora::continuous_dense_tag,remora::cpu_tag>,remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::dense_tag>
               (double f,long *m,long e)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  lVar1 = m[1];
  if (lVar1 != 0) {
    lVar5 = *m;
    lVar2 = m[2];
    lVar3 = m[3];
    lVar4 = *(long *)(e + 8);
    lVar6 = *(long *)(e + 0x10);
    lVar7 = 0;
    do {
      if (lVar2 != 0) {
        lVar8 = 0;
        do {
          *(double *)(lVar5 + lVar8 * 8) =
               *(double *)(lVar6 + lVar8 * 8) * f + *(double *)(lVar5 + lVar8 * 8);
          lVar8 = lVar8 + 1;
        } while (lVar2 != lVar8);
      }
      lVar7 = lVar7 + 1;
      lVar5 = lVar5 + lVar3 * 8;
      lVar6 = lVar6 + lVar4 * 8;
    } while (lVar7 != lVar1);
  }
  return;
}

Assistant:

void matrix_assign_functor(
	matrix_expression<M, cpu_tag>& m,
	matrix_expression<E, cpu_tag> const& e,
	F f,
	row_major, row_major, dense_tag, TagE
) {
	for(std::size_t i = 0; i != m().size1(); ++i){
		auto rowM = row(m,i);
		kernels::assign(rowM,row(e,i),f);
	}
}